

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

void __thiscall
duckdb_re2::NFA::AddToThreadq
          (NFA *this,Threadq *q,int id0,int c,StringPiece *context,char *p,Thread *t0)

{
  ushort uVar1;
  AddState *pAVar2;
  IndexValue *pIVar3;
  Inst *pIVar4;
  uint uVar5;
  uint32_t uVar6;
  Thread *pTVar7;
  char **ppcVar8;
  ostream *poVar9;
  int iVar10;
  Thread **ppTVar11;
  _Elt_pointer pTVar12;
  uint uVar13;
  size_t __n;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
  i;
  Thread *pTVar14;
  size_t sVar15;
  ulong local_200;
  Thread *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (id0 == 0) {
    return;
  }
  pAVar2 = (this->stack_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl;
  pAVar2->id = id0;
  pAVar2->t = (Thread *)0x0;
  local_200 = 1;
LAB_011cdde8:
  local_200 = (ulong)((int)local_200 - 1);
  i._M_head_impl.len_ = (Deleter)pAVar2[local_200].id;
  pTVar7 = pAVar2[local_200].t;
LAB_011cde00:
  pTVar14 = t0;
  if ((pTVar7 != (Thread *)0x0) &&
     (iVar10 = (t0->field_0).ref, (t0->field_0).ref = iVar10 + -1, pTVar14 = pTVar7, iVar10 < 2)) {
    t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
    this->freelist_ = t0;
  }
  t0 = pTVar14;
  if (i._M_head_impl.len_ == 0) goto switchD_011cdeb2_caseD_7;
  pIVar3 = (q->dense_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
           .
           super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
           ._M_head_impl;
  if ((((pIVar3 != (IndexValue *)0x0) &&
       ((uint)i._M_head_impl.len_ <
        (uint)*(int *)&(q->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                       .
                       super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                       .
                       super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
       )) && (uVar5 = (q->sparse_).ptr_._M_t.
                      super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                      super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_],
             uVar5 < (uint)q->size_)) && ((Deleter)pIVar3[(int)uVar5].index_ == i._M_head_impl.len_)
     ) goto switchD_011cdeb2_caseD_7;
  local_1b0 = (Thread *)0x0;
  SparseArray<duckdb_re2::NFA::Thread_*>::SetInternal(q,false,(int)i._M_head_impl.len_,&local_1b0);
  ppTVar11 = &(q->dense_).ptr_._M_t.
              super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              .
              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
              ._M_head_impl
              [(q->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>
               ._M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_]].value_;
  pIVar4 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
           ((long)&(this->prog_->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl;
  uVar5 = pIVar4[(int)i._M_head_impl.len_].out_opcode_;
  iVar10 = (int)local_200;
  pTVar14 = t0;
  switch(uVar5 & 7) {
  case 0:
    goto switchD_011cdeb2_caseD_0;
  case 1:
    (t0->field_0).ref = (t0->field_0).ref + 1;
    *ppTVar11 = t0;
    uVar13 = 1;
    break;
  case 2:
    uVar13 = c;
    if ((pIVar4[(int)i._M_head_impl.len_].field_1.out1_ & 0x10000) != 0) {
      uVar13 = c | 0x20;
    }
    if (0x19 < c - 0x41U) {
      uVar13 = c;
    }
    if (((int)uVar13 < (int)(uint)pIVar4[(int)i._M_head_impl.len_].field_1.byte_range.lo_) ||
       ((int)(uint)pIVar4[(int)i._M_head_impl.len_].field_1.byte_range.hi_ < (int)uVar13))
    goto LAB_011cdecb;
    (t0->field_0).ref = (t0->field_0).ref + 1;
    *ppTVar11 = t0;
    uVar1 = pIVar4[(int)i._M_head_impl.len_].field_1.byte_range.hint_foldcase_;
    if (uVar1 < 2) goto switchD_011cdeb2_caseD_7;
    uVar13 = (uint)(uVar1 >> 1);
    break;
  case 3:
    if ((uVar5 & 8) == 0) {
      local_200 = (ulong)(iVar10 + 1);
      pAVar2[iVar10].id = (int)i._M_head_impl.len_ + 1;
      pAVar2[iVar10].t = (Thread *)0x0;
    }
    iVar10 = pIVar4[(int)i._M_head_impl.len_].field_1.cap_;
    if (iVar10 < this->ncapture_) {
      pAVar2[(int)local_200].id = 0;
      pAVar2[(int)local_200].t = t0;
      pTVar14 = this->freelist_;
      if (pTVar14 == (Thread *)0x0) {
        pTVar12 = (this->arena_).
                  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pTVar12 ==
            (this->arena_).
            super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>::
          _M_push_back_aux<>(&this->arena_);
          pTVar12 = (this->arena_).
                    super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        else {
          (pTVar12->field_0).next = (Thread *)0x0;
          pTVar12->capture = (char **)0x0;
          pTVar12 = (this->arena_).
                    super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          (this->arena_).
          super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur = pTVar12;
        }
        if (pTVar12 ==
            (this->arena_).
            super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          pTVar12 = (this->arena_).
                    super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        pTVar14 = pTVar12 + -1;
        pTVar12[-1].field_0.ref = 1;
        __n = (long)this->ncapture_ * 8;
        sVar15 = __n;
        if ((long)this->ncapture_ < 0) {
          sVar15 = 0xffffffffffffffff;
        }
        ppcVar8 = (char **)operator_new__(sVar15);
        pTVar12[-1].capture = ppcVar8;
      }
      else {
        this->freelist_ = (Thread *)pTVar14->field_0;
        (pTVar14->field_0).ref = 1;
        __n = (long)this->ncapture_ << 3;
      }
      local_200 = (ulong)((int)local_200 + 1);
      memmove(pTVar14->capture,t0->capture,__n);
      pTVar14->capture[iVar10] = p;
    }
    goto LAB_011ce0f6;
  case 4:
    if ((uVar5 & 8) == 0) {
      local_200 = (ulong)(iVar10 + 1);
      pAVar2[iVar10].id = (int)i._M_head_impl.len_ + 1;
      pAVar2[iVar10].t = (Thread *)0x0;
    }
    uVar5 = pIVar4[(int)i._M_head_impl.len_].field_1.out1_;
    uVar6 = Prog::EmptyFlags(context,p);
    if ((uVar5 & ~uVar6) == 0) goto LAB_011ce0f6;
    goto switchD_011cdeb2_caseD_7;
  case 5:
    (t0->field_0).ref = (t0->field_0).ref + 1;
    *ppTVar11 = t0;
    uVar5 = pIVar4[(int)i._M_head_impl.len_].out_opcode_;
LAB_011cdecb:
    uVar13 = 1;
    if ((uVar5 & 8) != 0) goto switchD_011cdeb2_caseD_7;
    break;
  case 6:
    if ((uVar5 & 8) == 0) {
      local_200 = (ulong)(iVar10 + 1);
      pAVar2[iVar10].id = (int)i._M_head_impl.len_ + 1;
      pAVar2[iVar10].t = (Thread *)0x0;
    }
LAB_011ce0f6:
    i._M_head_impl.len_ = (Deleter)(pIVar4[(int)i._M_head_impl.len_].out_opcode_ >> 4);
    pTVar7 = (Thread *)0x0;
    t0 = pTVar14;
    goto LAB_011cde00;
  case 7:
    goto switchD_011cdeb2_caseD_7;
  }
  i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + uVar13);
  pTVar7 = (Thread *)0x0;
  goto LAB_011cde00;
switchD_011cdeb2_caseD_0:
  local_1b0 = (Thread *)((ulong)local_1b0 & 0xffffffffffffff00);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"unhandled ",10);
  poVar9 = (ostream *)
           std::ostream::operator<<(local_1a8,pIVar4[(int)i._M_head_impl.len_].out_opcode_ & 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," in AddToThreadq",0x10);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
switchD_011cdeb2_caseD_7:
  if ((int)local_200 < 1) {
    return;
  }
  goto LAB_011cdde8;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, const StringPiece& context,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = {id0, NULL};
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);
    Thread** tp = &q->get_existing(id);
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = {id+1, NULL};
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on.
      a = {ip->out(), NULL};
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = {0, t0};

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = {ip->out(), NULL};
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;

      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      if (ip->hint() == 0)
        break;
      a = {id+ip->hint(), NULL};
      goto Loop;

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

    Next:
      if (ip->last())
        break;
      a = {id+1, NULL};
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~Prog::EmptyFlags(context, p))
        break;
      a = {ip->out(), NULL};
      goto Loop;
    }
  }
}